

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

natwm_error string_strip_surrounding_spaces(char *string,char **dest,size_t *length)

{
  natwm_error nVar1;
  size_t local_38;
  size_t start;
  size_t end;
  size_t length_result;
  
  local_38 = 0;
  start = 0;
  end = 0;
  nVar1 = string_find_first_nonspace(string,&local_38);
  if (nVar1 == NO_ERROR) {
    nVar1 = string_find_last_nonspace(string,&start);
    if (nVar1 == NO_ERROR) {
      nVar1 = string_splice(string,local_38,start + 1,dest,&end);
      if (length != (size_t *)0x0) {
        *length = end;
      }
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error string_strip_surrounding_spaces(const char *string, char **dest, size_t *length)
{
        size_t start = 0;
        size_t end = 0;
        size_t length_result = 0;
        enum natwm_error err = GENERIC_ERROR;

        err = string_find_first_nonspace(string, &start);

        if (err != NO_ERROR) {
                return err;
        }

        err = string_find_last_nonspace(string, &end);

        if (err != NO_ERROR) {
                return err;
        }

        err = string_splice(string, start, end + 1, dest, &length_result);

        SET_IF_NON_NULL(length, length_result);

        return err;
}